

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Maj3_ManAddCnfStart(Maj3_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int (*paiVar9) [32];
  int (*paiVar10) [32];
  long lVar11;
  int pLits [32];
  
  lVar8 = (long)p->nVars;
  paiVar10 = p->VarMarks;
  paiVar9 = p->VarMarks + lVar8;
  while( true ) {
    uVar5 = p->nObjs;
    uVar2 = (ulong)(int)uVar5;
    if ((long)uVar2 <= lVar8) {
      lVar8 = 0;
      while( true ) {
        if ((int)uVar2 + -1 <= lVar8) {
          iVar6 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
          if (iVar6 == 1) {
            Maj3_ManVarMapPrint(p);
            return 1;
          }
          __assert_fail("status == GLUCOSE_SAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0x13f,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
        }
        uVar5 = 0;
        for (lVar11 = 0; (uVar2 & 0xffffffff) << 7 != lVar11; lVar11 = lVar11 + 0x80) {
          uVar5 = uVar5 + (*(int *)((long)*paiVar10 + lVar11) == 1);
        }
        if (3 < uVar5) break;
        if (uVar5 == 0) {
          iVar6 = 0;
          paiVar9 = paiVar10;
          for (lVar11 = 0; lVar11 < (int)uVar2; lVar11 = lVar11 + 1) {
            if (1 < (*paiVar9)[0]) {
              iVar1 = Abc_Var2Lit((*paiVar9)[0],0);
              lVar4 = (long)iVar6;
              iVar6 = iVar6 + 1;
              pLits[lVar4] = iVar1;
              uVar2 = (ulong)(uint)p->nObjs;
            }
            paiVar9 = paiVar9 + 1;
          }
          if (0 < iVar6) {
            iVar6 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar6);
            if (iVar6 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                            ,0x13c,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
            }
            uVar2 = (ulong)(uint)p->nObjs;
          }
        }
        lVar8 = lVar8 + 1;
        paiVar10 = (int (*) [32])(*paiVar10 + 1);
      }
      __assert_fail("Count <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                    ,0x131,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
    }
    uVar3 = 0;
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = (ulong)uVar5;
    }
    uVar5 = 0;
    for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      uVar5 = uVar5 + ((*paiVar9)[uVar3] == 1);
    }
    if (3 < uVar5) break;
    if (uVar5 != 3) {
      iVar6 = 0;
      for (lVar11 = 0; lVar11 < (int)uVar2; lVar11 = lVar11 + 1) {
        if (1 < (*paiVar9)[lVar11]) {
          iVar1 = Abc_Var2Lit((*paiVar9)[lVar11],0);
          lVar4 = (long)iVar6;
          iVar6 = iVar6 + 1;
          pLits[lVar4] = iVar1;
          uVar2 = (ulong)(uint)p->nObjs;
        }
      }
      if (iVar6 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x125,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
      }
      iVar6 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar6);
      if (iVar6 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x127,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
      }
    }
    lVar8 = lVar8 + 1;
    paiVar9 = paiVar9 + 1;
  }
  __assert_fail("Count <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0x11c,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
}

Assistant:

int Maj3_ManAddCnfStart( Maj3_Man_t * p )
{
    int i, k, status, nLits, pLits[MAJ3_OBJS];
    // nodes have at least one fanin
    //printf( "Fanin clauses:\n" );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // check if it is already connected
        int Count = 0;
        for ( k = 0; k < p->nObjs; k++ ) 
            Count += p->VarMarks[i][k] == 1;
        assert( Count <= 3 );
        if ( Count == 3 )
            continue;
        // collect connections
        nLits = 0;
        for ( k = 0; k < p->nObjs; k++ ) 
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 0 );
        //Maj3_PrintClause( pLits, nLits );
        assert( nLits > 0 );
        if ( nLits > 0 && !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            assert(0);
    }
    // nodes have at least one fanout
    //printf( "Fanout clauses:\n" );
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        // check if it is already connected
        int Count = 0;
        for ( i = 0; i < p->nObjs; i++ ) 
            Count += p->VarMarks[i][k] == 1;
        assert( Count <= 3 );
        if ( Count > 0 )
            continue;
        // collect connections
        nLits = 0;
        for ( i = 0; i < p->nObjs; i++ ) 
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 0 );
        //Maj3_PrintClause( pLits, nLits );
        //assert( nLits > 0 );
        if ( nLits > 0 && !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            assert(0);
    }
    status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
    assert( status == GLUCOSE_SAT );
    Maj3_ManVarMapPrint( p );
    return 1;
}